

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
slang::parsing::Lexer::scanEncodedText
          (Lexer *this,ProtectEncoding encoding,uint32_t expectedBytes,bool singleLine,
          bool legacyProtectedMode)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  Diagnostic *pDVar4;
  byte invalidChar;
  uint uVar5;
  char *pcVar6;
  undefined4 in_register_00000014;
  undefined8 uVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  anon_class_24_3_ac0d555d invalidByte;
  anon_class_16_2_98147aed lookingAtPragma;
  bool local_85;
  ProtectEncoding local_84;
  undefined8 local_80;
  bool local_71;
  ulong local_70;
  ulong local_68;
  byte *local_60;
  anon_class_24_3_ac0d555d local_58;
  anon_class_16_2_98147aed local_40;
  
  uVar7 = CONCAT44(in_register_00000014,expectedBytes);
  local_58.singleLine = &local_85;
  local_40.legacyProtectedMode = &local_71;
  local_58.lookingAtPragma = &local_40;
  local_68 = (ulong)expectedBytes;
  uVar11 = 0;
  local_85 = singleLine;
  local_84 = encoding;
  local_80 = uVar7;
  local_71 = legacyProtectedMode;
  local_58.this = this;
  local_40.this = this;
  do {
    uVar5 = (uint)uVar7;
    if ((expectedBytes - 1 < uVar11) && (local_85 == false)) {
      if (uVar11 == uVar5) {
        return;
      }
      pDVar4 = Diagnostics::add(this->diagnostics,(DiagCode)0x160002,
                                (SourceLocation)
                                ((long)(this->sourceBuffer + ~(ulong)this->originalBegin) *
                                 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
      local_70 = (ulong)uVar11;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,&local_70);
      local_70 = local_68;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,&local_70);
      return;
    }
    pbVar1 = (byte *)this->sourceBuffer;
    bVar8 = *pbVar1;
    uVar3 = uVar11;
    if ((bVar8 == 0xd) || (bVar8 == 10)) {
      if (local_85 == true) {
        lVar12 = 1;
        if ((uVar5 != 0) && (uVar11 != uVar5)) {
          pDVar4 = Diagnostics::add(this->diagnostics,(DiagCode)0x160002,
                                    (SourceLocation)
                                    ((long)(pbVar1 + ~(ulong)this->originalBegin) * 0x10000000 |
                                    (ulong)((this->bufferId).id & 0xfffffff)));
          local_70 = (ulong)uVar11;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar4->args,&local_70);
          local_70 = local_68;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar4->args,&local_70);
LAB_001d1c92:
          lVar12 = 1;
          uVar7 = local_80;
          encoding = local_84;
        }
      }
      else {
        this->sourceBuffer = (char *)(pbVar1 + 1);
        if ((bVar8 == 0xd) && (pbVar1[1] == 10)) {
          this->sourceBuffer = (char *)(pbVar1 + 2);
        }
        lVar12 = 0;
        if (((encoding == QuotedPrintable) && (uVar3 = uVar11 + 1, bVar8 == 0xd)) &&
           (this->sourceBuffer[-1] == '\n')) {
          uVar3 = uVar11 + 2;
        }
      }
      goto LAB_001d209f;
    }
    if (((uVar5 == 0) && (bVar8 == 0x60)) && (local_85 == false)) {
      pcVar6 = "pragma";
      if (*local_40.legacyProtectedMode != false) {
        pcVar6 = "endprotected";
      }
      lVar10 = 6;
      if (*local_40.legacyProtectedMode != false) {
        lVar10 = 0xc;
      }
      if ((local_40.this)->sourceBuffer[1] == *pcVar6) {
        lVar2 = 0;
        do {
          lVar9 = lVar2;
          lVar12 = 1;
          if (lVar10 + -1 == lVar9) goto LAB_001d209f;
          lVar2 = lVar9 + 1;
        } while ((local_40.this)->sourceBuffer[lVar9 + 2] == pcVar6[lVar9 + 1]);
        if (lVar10 + -1 == lVar9) goto LAB_001d209f;
      }
    }
    if (encoding < 4) {
      switch(encoding) {
      case UUEncode:
        if (bVar8 == 0x60) {
          this->sourceBuffer = (char *)(pbVar1 + 1);
          lVar12 = 0;
        }
        else if ((byte)(bVar8 + 0xb2) < 0xd2) {
          name_00._M_str = "uuencode";
          name_00._M_len = 8;
          scanEncodedText::anon_class_24_3_ac0d555d::operator()(&local_58,bVar8,name_00);
          lVar12 = 1;
          uVar7 = local_80;
          encoding = local_84;
        }
        else {
          local_60 = pbVar1 + 1;
          this->sourceBuffer = (char *)local_60;
          dVar14 = ceil((double)((char)bVar8 * 4 + -0x80) / 3.0);
          lVar12 = 4;
          uVar5 = (uint)(long)dVar14;
          bVar13 = uVar5 != 0;
          if (bVar13) {
            invalidChar = *local_60;
            if (0xbe < (byte)(invalidChar + 0x9f)) {
              lVar10 = 0;
              do {
                this->sourceBuffer = (char *)(pbVar1 + lVar10 + 2);
                if (uVar5 - 1 == (int)lVar10) {
                  bVar13 = false;
                  goto LAB_001d2038;
                }
                invalidChar = pbVar1[lVar10 + 2];
                lVar10 = lVar10 + 1;
              } while (0xbe < (byte)(invalidChar + 0x9f));
              bVar13 = (uint)lVar10 < uVar5;
            }
            name_02._M_str = "uuencode";
            name_02._M_len = 8;
            scanEncodedText::anon_class_24_3_ac0d555d::operator()(&local_58,invalidChar,name_02);
            lVar12 = 1;
          }
LAB_001d2038:
          uVar11 = (uVar11 + (int)(char)bVar8) - 0x20;
          uVar7 = local_80;
          uVar3 = uVar11;
          encoding = local_84;
          if (!bVar13) goto LAB_001d209c;
        }
        break;
      case Base64:
        uVar11 = uVar11 + 3;
        bVar13 = false;
        uVar5 = 0;
        pbVar1 = (byte *)this->sourceBuffer;
        do {
          bVar8 = *pbVar1;
          if ((uVar5 < 2) || (bVar8 != 0x3d)) {
            if ((bVar8 & 0xfb) != 0x2b &&
                ((0x19 < (byte)(bVar8 + 0x9f) && 9 < (byte)(bVar8 - 0x30)) &&
                0x19 < (byte)(bVar8 + 0xbf))) {
              name_01._M_str = "base64";
              name_01._M_len = 6;
              scanEncodedText::anon_class_24_3_ac0d555d::operator()(&local_58,bVar8,name_01);
              lVar12 = 1;
              uVar7 = local_80;
              encoding = local_84;
              goto LAB_001d1f78;
            }
          }
          else {
            uVar11 = uVar11 - 1;
          }
          this->sourceBuffer = (char *)(pbVar1 + 1);
          bVar13 = 2 < uVar5;
          uVar5 = uVar5 + 1;
          pbVar1 = pbVar1 + 1;
        } while (uVar5 != 4);
        lVar12 = 8;
LAB_001d1f78:
        uVar3 = uVar11;
        if (bVar13) goto LAB_001d209c;
        break;
      case QuotedPrintable:
        if (bVar8 != 9 && 0x5e < (byte)(bVar8 - 0x20)) {
LAB_001d1ef1:
          name._M_str = "quoted-printable";
          name._M_len = 0x10;
          scanEncodedText::anon_class_24_3_ac0d555d::operator()(&local_58,bVar8,name);
          goto LAB_001d1c92;
        }
        this->sourceBuffer = (char *)(pbVar1 + 1);
        uVar7 = local_80;
        if (bVar8 == 0x3d) {
          bVar8 = pbVar1[1];
          if ((bVar8 == 0xd) || (bVar8 == 10)) {
            this->sourceBuffer = (char *)(pbVar1 + 2);
            lVar12 = 0;
            if ((bVar8 == 0xd) && (pbVar1[2] == 10)) {
              this->sourceBuffer = (char *)(pbVar1 + 3);
            }
            break;
          }
          if (((9 < (byte)(bVar8 - 0x30)) &&
              ((0x25 < bVar8 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar8 - 0x41) & 0x3f) & 1) == 0))
              )) || ((9 < (byte)(pbVar1[2] - 0x30) &&
                     ((uVar5 = pbVar1[2] - 0x41, 0x25 < uVar5 ||
                      ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))) goto LAB_001d1ef1;
          this->sourceBuffer = (char *)(pbVar1 + 3);
        }
        uVar11 = uVar11 + 1;
        goto LAB_001d209c;
      case Raw:
        if ((bVar8 != 0) || (pbVar1 < this->sourceEnd + -1)) {
          this->sourceBuffer = (char *)(pbVar1 + 1);
          uVar11 = uVar11 + 1;
          goto LAB_001d209c;
        }
        Diagnostics::add(this->diagnostics,(DiagCode)0x170002,
                         (SourceLocation)
                         ((long)(pbVar1 + ~(ulong)this->originalBegin) * 0x10000000 |
                         (ulong)((this->bufferId).id & 0xfffffff)));
        lVar12 = 1;
        uVar7 = local_80;
        encoding = local_84;
      }
    }
    else {
LAB_001d209c:
      lVar12 = 0;
      uVar3 = uVar11;
    }
LAB_001d209f:
    uVar11 = uVar3;
    if (lVar12 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void Lexer::scanEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                            bool legacyProtectedMode) {
    // Helper function that returns true if the current position in the buffer
    // is looking at the string "pragma".
    auto lookingAtPragma = [&] {
        int index = 0;
        auto endStr = legacyProtectedMode ? "endprotected"sv : "pragma"sv;
        for (char c : endStr) {
            if (peek(++index) != c)
                return false;
        }
        return true;
    };

    auto invalidByte = [&](char invalidChar, std::string_view name) {
        auto& diag = addDiag(diag::InvalidEncodingByte, currentOffset()) << name;
        diag << (isPrintableASCII(invalidChar) ? std::string(1, invalidChar)
                                               : fmt::format("{:#04x}", invalidChar));

        // Try to skip ahead to the next `pragma directive to get us out of this region.
        while (true) {
            char c = peek();
            if (c == '\0' && reallyAtEnd())
                break;

            if (c == '`' && lookingAtPragma())
                break;

            if (singleLine && (c == '\r' || c == '\n'))
                break;

            advance();
        }
    };

    uint32_t byteCount = 0;
    while (true) {
        if (expectedBytes && byteCount >= expectedBytes && !singleLine) {
            if (byteCount != expectedBytes) {
                addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                    << byteCount << expectedBytes;
            }
            return;
        }

        char c = peek();
        if (c == '\r' || c == '\n') {
            // If this is a single line region then we're done here.
            if (singleLine) {
                if (expectedBytes && byteCount != expectedBytes) {
                    addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                        << byteCount << expectedBytes;
                }
                return;
            }

            // Otherwise continue on. This newline doesn't count toward our expected byte limit,
            // unless this is the quoted printable encoding.
            advance();
            if (c == '\r' && peek() == '\n')
                advance();

            if (encoding == ProtectEncoding::QuotedPrintable) {
                byteCount++;
                if (c == '\r' && peek(-1) == '\n')
                    byteCount++;
            }

            continue;
        }

        if (!expectedBytes && !singleLine && c == '`') {
            // Encoding tools probably shouldn't do this but if they do we
            // should try to gracefully guess the end of the region by looking
            // for another non-encoded pragma that ends it.
            if (lookingAtPragma())
                return;
        }

        switch (encoding) {
            case ProtectEncoding::UUEncode: {
                // uuencode tells us the length of the line up front, so use that
                // to read the whole line in one go. The encoding is invalid if that
                // doesn't match up with what we find in the data.
                if (c == '`') {
                    // The grave character is a special case meaning 0 characters on this line.
                    advance();
                    continue;
                }

                if (c < 0x20 || c > 0x20 + 45) {
                    invalidByte(c, "uuencode"sv);
                    return;
                }

                uint32_t count = uint32_t(c - 0x20);
                byteCount += count;
                advance();

                uint32_t encodedCount = (uint32_t)ceil(count * 4 / 3.0);
                for (uint32_t i = 0; i < encodedCount; i++) {
                    c = peek();
                    if (c < 0x20 || c > 0x60) {
                        invalidByte(c, "uuencode"sv);
                        return;
                    }
                    advance();
                }
                break;
            }
            case ProtectEncoding::Base64:
                byteCount += 3;
                for (int i = 0; i < 4; i++) {
                    c = peek();
                    if (i > 1 && c == '=') {
                        byteCount--;
                    }
                    else if (!isBase64Char(c)) {
                        invalidByte(c, "base64"sv);
                        return;
                    }

                    advance();
                }
                break;
            case ProtectEncoding::QuotedPrintable:
                if (!isPrintableASCII(c) && c != '\t') {
                    invalidByte(c, "quoted-printable"sv);
                    return;
                }

                advance();
                if (c == '=') {
                    // If this is a soft line break then it doesn't count
                    // towards our byte count. Otherwise this is an escaped
                    // character that does count.
                    c = peek();
                    if (c == '\r' || c == '\n') {
                        advance();
                        if (c == '\r' && peek() == '\n')
                            advance();
                        continue;
                    }

                    if (!isHexDigit(c) || !isHexDigit(peek(1))) {
                        invalidByte(c, "quoted-printable"sv);
                        return;
                    }

                    advance(2);
                }
                byteCount++;
                break;
            case ProtectEncoding::Raw:
                if (c == '\0' && reallyAtEnd()) {
                    addDiag(diag::RawProtectEOF, currentOffset() - 1);
                    return;
                }

                advance();
                byteCount++;
                break;
        }
    }
}